

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c74_mock_clock.h
# Opt level: O0

void __thiscall c74::mock::clock::tick(clock *this)

{
  __atomic_flag_data_type _Var1;
  bool bVar2;
  reference lhs;
  time_point rhs;
  reference peVar3;
  pointer this_00;
  _Rb_tree_const_iterator<c74::mock::clock::event> local_120;
  duration<long,_std::ratio<3600L,_1L>_> local_118;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_110;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_108;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  next;
  event *e_3;
  iterator __end3_3;
  iterator __begin3_3;
  vector<c74::mock::clock::event,_std::allocator<c74::mock::clock::event>_> *__range3_3;
  event *e_2;
  iterator __end3_2;
  iterator __begin3_2;
  vector<c74::mock::clock::event,_std::allocator<c74::mock::clock::event>_> *__range3_2;
  event *e_1;
  iterator __end3_1;
  iterator __begin3_1;
  multiset<c74::mock::clock::event,_std::less<c74::mock::clock::event>,_std::allocator<c74::mock::clock::event>_>
  *__range3_1;
  vector<c74::mock::clock::event,_std::allocator<c74::mock::clock::event>_> events_that_ran;
  event *e;
  iterator __end3;
  iterator __begin3;
  vector<c74::mock::clock::event,_std::allocator<c74::mock::clock::event>_> *__range3;
  undefined1 local_40 [8];
  unique_lock<std::mutex> scheduled_lock;
  unique_lock<std::mutex> pending_lock;
  clock *this_local;
  
  do {
    LOCK();
    _Var1 = (this->run_thread).super___atomic_flag_base._M_i;
    (this->run_thread).super___atomic_flag_base._M_i = true;
    UNLOCK();
    if (_Var1 == false) {
      return;
    }
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)&scheduled_lock._M_owns,&this->pending_events_mutex);
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)local_40,&this->scheduled_events_mutex);
    __end3 = std::vector<c74::mock::clock::event,_std::allocator<c74::mock::clock::event>_>::begin
                       (&this->pending_events);
    e = (event *)std::vector<c74::mock::clock::event,_std::allocator<c74::mock::clock::event>_>::end
                           (&this->pending_events);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<c74::mock::clock::event_*,_std::vector<c74::mock::clock::event,_std::allocator<c74::mock::clock::event>_>_>
                                       *)&e), bVar2) {
      peVar3 = __gnu_cxx::
               __normal_iterator<c74::mock::clock::event_*,_std::vector<c74::mock::clock::event,_std::allocator<c74::mock::clock::event>_>_>
               ::operator*(&__end3);
      events_that_ran.
      super__Vector_base<c74::mock::clock::event,_std::allocator<c74::mock::clock::event>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)std::
                    multiset<c74::mock::clock::event,_std::less<c74::mock::clock::event>,_std::allocator<c74::mock::clock::event>_>
                    ::insert(&this->scheduled_events,peVar3);
      __gnu_cxx::
      __normal_iterator<c74::mock::clock::event_*,_std::vector<c74::mock::clock::event,_std::allocator<c74::mock::clock::event>_>_>
      ::operator++(&__end3);
    }
    std::vector<c74::mock::clock::event,_std::allocator<c74::mock::clock::event>_>::clear
              (&this->pending_events);
    std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)&scheduled_lock._M_owns);
    std::vector<c74::mock::clock::event,_std::allocator<c74::mock::clock::event>_>::vector
              ((vector<c74::mock::clock::event,_std::allocator<c74::mock::clock::event>_> *)
               &__range3_1);
    __end3_1 = std::
               multiset<c74::mock::clock::event,_std::less<c74::mock::clock::event>,_std::allocator<c74::mock::clock::event>_>
               ::begin(&this->scheduled_events);
    e_1 = (event *)std::
                   multiset<c74::mock::clock::event,_std::less<c74::mock::clock::event>,_std::allocator<c74::mock::clock::event>_>
                   ::end(&this->scheduled_events);
    while (bVar2 = std::operator!=(&__end3_1,(_Self *)&e_1), bVar2) {
      lhs = std::_Rb_tree_const_iterator<c74::mock::clock::event>::operator*(&__end3_1);
      rhs = now(this);
      bVar2 = operator>(lhs,(timepoint)rhs.__d.__r);
      if (bVar2) break;
      std::vector<c74::mock::clock::event,_std::allocator<c74::mock::clock::event>_>::push_back
                ((vector<c74::mock::clock::event,_std::allocator<c74::mock::clock::event>_> *)
                 &__range3_1,lhs);
      event::operator()(lhs);
      std::_Rb_tree_const_iterator<c74::mock::clock::event>::operator++(&__end3_1);
    }
    __end3_2 = std::vector<c74::mock::clock::event,_std::allocator<c74::mock::clock::event>_>::begin
                         ((vector<c74::mock::clock::event,_std::allocator<c74::mock::clock::event>_>
                           *)&__range3_1);
    e_2 = (event *)std::vector<c74::mock::clock::event,_std::allocator<c74::mock::clock::event>_>::
                   end((vector<c74::mock::clock::event,_std::allocator<c74::mock::clock::event>_> *)
                       &__range3_1);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3_2,
                              (__normal_iterator<c74::mock::clock::event_*,_std::vector<c74::mock::clock::event,_std::allocator<c74::mock::clock::event>_>_>
                               *)&e_2), bVar2) {
      peVar3 = __gnu_cxx::
               __normal_iterator<c74::mock::clock::event_*,_std::vector<c74::mock::clock::event,_std::allocator<c74::mock::clock::event>_>_>
               ::operator*(&__end3_2);
      std::
      multiset<c74::mock::clock::event,_std::less<c74::mock::clock::event>,_std::allocator<c74::mock::clock::event>_>
      ::erase(&this->scheduled_events,peVar3);
      __gnu_cxx::
      __normal_iterator<c74::mock::clock::event_*,_std::vector<c74::mock::clock::event,_std::allocator<c74::mock::clock::event>_>_>
      ::operator++(&__end3_2);
    }
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&scheduled_lock._M_owns);
    __end3_3 = std::vector<c74::mock::clock::event,_std::allocator<c74::mock::clock::event>_>::begin
                         (&this->pending_events);
    e_3 = (event *)std::vector<c74::mock::clock::event,_std::allocator<c74::mock::clock::event>_>::
                   end(&this->pending_events);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3_3,
                              (__normal_iterator<c74::mock::clock::event_*,_std::vector<c74::mock::clock::event,_std::allocator<c74::mock::clock::event>_>_>
                               *)&e_3), bVar2) {
      peVar3 = __gnu_cxx::
               __normal_iterator<c74::mock::clock::event_*,_std::vector<c74::mock::clock::event,_std::allocator<c74::mock::clock::event>_>_>
               ::operator*(&__end3_3);
      next.__d.__r = (duration)
                     std::
                     multiset<c74::mock::clock::event,_std::less<c74::mock::clock::event>,_std::allocator<c74::mock::clock::event>_>
                     ::insert(&this->scheduled_events,peVar3);
      __gnu_cxx::
      __normal_iterator<c74::mock::clock::event_*,_std::vector<c74::mock::clock::event,_std::allocator<c74::mock::clock::event>_>_>
      ::operator++(&__end3_3);
    }
    std::vector<c74::mock::clock::event,_std::allocator<c74::mock::clock::event>_>::clear
              (&this->pending_events);
    bVar2 = std::
            multiset<c74::mock::clock::event,_std::less<c74::mock::clock::event>,_std::allocator<c74::mock::clock::event>_>
            ::empty(&this->scheduled_events);
    if (bVar2) {
      local_110.__d.__r = (duration)now(this);
      local_118.__r = (rep)h<(char)49>();
      local_108 = std::chrono::operator+(&local_110,&local_118);
    }
    else {
      local_120._M_node =
           (_Base_ptr)
           std::
           multiset<c74::mock::clock::event,_std::less<c74::mock::clock::event>,_std::allocator<c74::mock::clock::event>_>
           ::begin(&this->scheduled_events);
      this_00 = std::_Rb_tree_const_iterator<c74::mock::clock::event>::operator->(&local_120);
      local_108.__d.__r = (duration)event::onset(this_00);
    }
    std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_40);
    std::condition_variable::wait_until<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
              (&this->cv,(unique_lock<std::mutex> *)&scheduled_lock._M_owns,&local_108);
    std::vector<c74::mock::clock::event,_std::allocator<c74::mock::clock::event>_>::~vector
              ((vector<c74::mock::clock::event,_std::allocator<c74::mock::clock::event>_> *)
               &__range3_1);
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_40);
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&scheduled_lock._M_owns);
  } while( true );
}

Assistant:

void tick() {
			while (run_thread.test_and_set()) {
#ifdef WIN_VERSION
				// On Windows an exception will be thrown when we try to lock the mutex wihout some sort of time passage
				// (either a console post or an explicit short delay)
				// std::cout << c74::mock::clock::tick()" << std::endl;
				std::this_thread::sleep_for(1ms);
#endif
				std::unique_lock<std::mutex> pending_lock(pending_events_mutex);
				std::unique_lock<std::mutex> scheduled_lock(scheduled_events_mutex);

				// update list of events
				for (auto &e : pending_events)
					scheduled_events.insert(e);
				pending_events.clear();

				// User code can add new events, so don't lock pending_events
				// while calling the scheduled events!
				pending_lock.unlock();

				std::vector<event> events_that_ran;
				for (auto& e : scheduled_events) {
					if (e > now()) {
						//std::cout << time(now()) << " (all remaining events in the future)" << std::endl;
						break;
					}
					//std::cout << time(now()) << " (event to run)" << std::endl;
					events_that_ran.push_back(e);
					e();
				}

				// purge events that have run
				for (auto& e : events_that_ran)
					scheduled_events.erase(e);


				// events themselves may have added new (pending) events
				pending_lock.lock();
				for (auto &e : pending_events)
					scheduled_events.insert(e);
				pending_events.clear();
        
				const auto next = scheduled_events.empty() ? now()+1h : scheduled_events.begin()->onset();
				scheduled_lock.unlock(); // we're not touching any scheduled events anymore. Unlock the scheduled_events_mutex.
				cv.wait_until(pending_lock, next);
			}
        }